

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderScalarN
               (char *label,ImGuiDataType data_type,void *v,int components,void *v_min,void *v_max,
               char *format,float power)

{
  ImGuiWindow *pIVar1;
  size_t sVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  char *text_end;
  bool bVar5;
  int int_id;
  float w_full;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  int_id = 0;
  bVar5 = false;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    w_full = CalcItemWidth();
    PushMultiItemsWidths(components,w_full);
    sVar2 = GDataTypeInfo[data_type].Size;
    if (components < 1) {
      components = 0;
    }
    bVar5 = false;
    for (; components != int_id; int_id = int_id + 1) {
      PushID(int_id);
      if (int_id != 0) {
        SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      }
      bVar4 = SliderScalar("",data_type,v,v_min,v_max,format,power);
      bVar5 = (bool)(bVar5 | bVar4);
      PopID();
      PopItemWidth();
      v = (void *)((long)v + sVar2);
    }
    PopID();
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    if (text_end != label) {
      SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
      TextEx(label,text_end,0);
    }
    EndGroup();
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components, CalcItemWidth());
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        if (i > 0)
            SameLine(0, g.Style.ItemInnerSpacing.x);
        value_changed |= SliderScalar("", data_type, v, v_min, v_max, format, power);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    const char* label_end = FindRenderedTextEnd(label);
    if (label != label_end)
    {
        SameLine(0, g.Style.ItemInnerSpacing.x);
        TextEx(label, label_end);
    }

    EndGroup();
    return value_changed;
}